

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O0

int gen_builder_struct_call_list
              (fb_output_t *out,fb_compound_type_t *ct,int index,int arg_count,int is_macro)

{
  int iVar1;
  int local_28;
  int len;
  int i;
  int is_macro_local;
  int arg_count_local;
  int index_local;
  fb_compound_type_t *ct_local;
  fb_output_t *out_local;
  
  iVar1 = get_total_struct_field_count(ct);
  is_macro_local = index;
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    gen_comma(out,local_28,arg_count,is_macro);
    is_macro_local = is_macro_local + 1;
    fprintf((FILE *)out->fp,"v%i");
  }
  return is_macro_local;
}

Assistant:

static int gen_builder_struct_call_list(fb_output_t *out, fb_compound_type_t *ct, int index, int arg_count, int is_macro)
{
    int i;
    int len = get_total_struct_field_count(ct);

    for (i = 0; i < len; ++i) {
        gen_comma(out, i, arg_count, is_macro);
        fprintf(out->fp, "v%i", index++);
    }
    return index;
}